

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseCharRef(xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  int local_20;
  int local_1c;
  int count;
  int val;
  xmlParserCtxtPtr ctxt_local;
  
  local_1c = 0;
  local_20 = 0;
  if (((*ctxt->input->cur == '&') && (ctxt->input->cur[1] == '#')) && (ctxt->input->cur[2] == 'x'))
  {
    ctxt->input->cur = ctxt->input->cur + 3;
    ctxt->input->col = ctxt->input->col + 3;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    do {
      bVar1 = false;
      if (*ctxt->input->cur != ';') {
        bVar1 = ctxt->disableSAX < 2;
      }
      if (!bVar1) goto LAB_00138684;
      bVar1 = 0x14 < local_20;
      local_20 = local_20 + 1;
      if (((bVar1) && (local_20 = 0, (ctxt->input->flags & 0x40U) == 0)) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      if ((*ctxt->input->cur < 0x30) || (0x39 < *ctxt->input->cur)) {
        if ((*ctxt->input->cur < 0x61) || ((0x66 < *ctxt->input->cur || (0x13 < local_20)))) {
          if ((*ctxt->input->cur < 0x41) || ((0x46 < *ctxt->input->cur || (0x13 < local_20))))
          goto LAB_0013863e;
          local_1c = local_1c * 0x10 + (uint)*ctxt->input->cur + -0x37;
        }
        else {
          local_1c = local_1c * 0x10 + (uint)*ctxt->input->cur + -0x57;
        }
      }
      else {
        local_1c = local_1c * 0x10 + (*ctxt->input->cur - 0x30);
      }
      if (0x110000 < local_1c) {
        local_1c = 0x110000;
      }
      xmlNextChar(ctxt);
      local_20 = local_20 + 1;
    } while( true );
  }
  if ((*ctxt->input->cur == '&') && (ctxt->input->cur[1] == '#')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    while (*ctxt->input->cur != ';') {
      bVar1 = 0x14 < local_20;
      local_20 = local_20 + 1;
      if (((bVar1) && (local_20 = 0, (ctxt->input->flags & 0x40U) == 0)) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      if ((*ctxt->input->cur < 0x30) || (0x39 < *ctxt->input->cur)) {
        xmlFatalErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,(char *)0x0);
        local_1c = 0;
        break;
      }
      local_1c = local_1c * 10 + (*ctxt->input->cur - 0x30);
      if (0x110000 < local_1c) {
        local_1c = 0x110000;
      }
      xmlNextChar(ctxt);
      local_20 = local_20 + 1;
    }
    if (*ctxt->input->cur == ';') {
      ctxt->input->col = ctxt->input->col + 1;
      ctxt->input->cur = ctxt->input->cur + 1;
    }
  }
  else {
    if (*ctxt->input->cur == '&') {
      ctxt->input->cur = ctxt->input->cur + 1;
      ctxt->input->col = ctxt->input->col + 1;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
    }
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
  }
LAB_0013891c:
  if (local_1c < 0x110000) {
    if (local_1c < 0x100) {
      if ((((8 < local_1c) && (local_1c < 0xb)) || (local_1c == 0xd)) || (0x1f < local_1c)) {
        return local_1c;
      }
    }
    else {
      if ((0xff < local_1c) && (local_1c < 0xd800)) {
        return local_1c;
      }
      if ((0xdfff < local_1c) && (local_1c < 0xfffe)) {
        return local_1c;
      }
      if ((0xffff < local_1c) && (local_1c < 0x110000)) {
        return local_1c;
      }
    }
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseCharRef: invalid xmlChar value %d\n",
                      local_1c);
  }
  else {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                      "xmlParseCharRef: character reference out of bounds\n",local_1c);
  }
  return 0;
LAB_0013863e:
  xmlFatalErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,(char *)0x0);
  local_1c = 0;
LAB_00138684:
  if (*ctxt->input->cur == ';') {
    ctxt->input->col = ctxt->input->col + 1;
    ctxt->input->cur = ctxt->input->cur + 1;
  }
  goto LAB_0013891c;
}

Assistant:

int
xmlParseCharRef(xmlParserCtxtPtr ctxt) {
    int val = 0;
    int count = 0;

    /*
     * Using RAW/CUR/NEXT is okay since we are working on ASCII range here
     */
    if ((RAW == '&') && (NXT(1) == '#') &&
        (NXT(2) == 'x')) {
	SKIP(3);
	GROW;
	while ((RAW != ';') && (PARSER_STOPPED(ctxt) == 0)) {
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 16 + (CUR - '0');
	    else if ((RAW >= 'a') && (RAW <= 'f') && (count < 20))
	        val = val * 16 + (CUR - 'a') + 10;
	    else if ((RAW >= 'A') && (RAW <= 'F') && (count < 20))
	        val = val * 16 + (CUR - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else if  ((RAW == '&') && (NXT(1) == '#')) {
	SKIP(2);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 10 + (CUR - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else {
        if (RAW == '&')
            SKIP(1);
        xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
    }

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseCharRef: character reference out of bounds\n",
	        val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseCharRef: invalid xmlChar value %d\n",
	                  val);
    }
    return(0);
}